

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::StockPileWithCardsTest_tryPullOutLastCard_Test::TestBody
          (StockPileWithCardsTest_tryPullOutLastCard_Test *this)

{
  bool bVar1;
  reference pvVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  undefined1 extraout_DL;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  Cards *this_00;
  shared_ptr<solitaire::piles::StockPile> *this_01;
  AssertHelper local_e8;
  Message local_e0;
  int local_d4;
  _Optional_payload_base<unsigned_int> local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_a8;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_90;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  _Storage<solitaire::cards::Card,_true> local_48;
  undefined4 local_40;
  _Storage<solitaire::cards::Card,_true> local_38;
  undefined4 local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  Card lastCard;
  StockPileWithCardsTest_tryPullOutLastCard_Test *this_local;
  
  this_00 = &(this->super_StockPileWithCardsTest).pileCards;
  pvVar2 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::back
                     (this_00);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         *)pvVar2;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::pop_back(this_00);
  this_01 = &(this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile;
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[4])();
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[4])();
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[4])();
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  local_48._0_4_ = (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[5])();
  local_48._M_value.suit = extraout_var;
  local_40 = CONCAT31(local_40._1_3_,extraout_DL);
  local_30 = local_40;
  local_38 = local_48;
  testing::internal::EqHelper::
  Compare<std::optional<solitaire::cards::Card>,_solitaire::cards::Card,_nullptr>
            ((EqHelper *)local_28,"pile->tryPullOutCard()","lastCard",
             (optional<solitaire::cards::Card> *)&local_38._M_value,(Card *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x6b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_a8,(testing *)&(this->super_StockPileWithCardsTest).pileCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_90,(internal *)&local_a8,matcher);
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile);
  (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_78,(char *)&local_90,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_90);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x6c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile);
  local_d0._M_payload._M_value = (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[7])();
  local_d0._4_4_ = extraout_var_00;
  local_d4 = 1;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_int,_nullptr>
            ((EqHelper *)local_c8,"pile->getSelectedCardIndex()","1",
             (optional<unsigned_int> *)&local_d0,&local_d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x6d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  return;
}

Assistant:

TEST_F(StockPileWithCardsTest, tryPullOutLastCard) {
    const Card lastCard = pileCards.back();
    pileCards.pop_back();

    pile->trySelectNextCard();
    pile->trySelectNextCard();
    pile->trySelectNextCard();

    EXPECT_EQ(pile->tryPullOutCard(), lastCard);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getSelectedCardIndex(), 1);
}